

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::Material
          (FormattingScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  ostream *poVar1;
  ParameterDictionary *in_RDX;
  string *in_RSI;
  FormattingScene *in_RDI;
  string newName;
  string extra;
  ParameterDictionary dict;
  ParameterDictionary *in_stack_00000968;
  string *in_stack_00000970;
  FormattingScene *in_stack_00000978;
  FileLoc in_stack_00000990;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffe00;
  polymorphic_allocator<pbrt::ParsedParameter_*> *in_stack_fffffffffffffe10;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffe18;
  RGBColorSpace *colorSpace;
  int extra_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_type *fmt;
  string local_1b8 [24];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe60;
  ParameterDictionary *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe74;
  ParameterDictionary *in_stack_fffffffffffffe78;
  string local_158 [32];
  string local_138 [32];
  string local_118 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [6];
  string *local_10;
  
  colorSpace = (RGBColorSpace *)&stack0x00000008;
  args = local_e8;
  local_10 = in_RSI;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            (&in_stack_fffffffffffffe00->alloc);
  fmt = &local_e8[0]._M_string_length;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)colorSpace,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  ParameterDictionary::ParameterDictionary(in_RDX,(ParsedParameterVector *)in_RDI,colorSpace);
  extra_00 = (int)((ulong)colorSpace >> 0x20);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(in_stack_fffffffffffffe00);
  if ((in_RDI->upgrade & 1U) != 0) {
    ParameterDictionary::RenameUsedTextures(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  }
  std::__cxx11::string::string(local_118);
  std::__cxx11::string::string(local_138,local_10);
  if ((in_RDI->upgrade & 1U) != 0) {
    upgradeMaterial(in_stack_00000978,in_stack_00000970,in_stack_00000968,in_stack_00000990);
    std::__cxx11::string::operator=(local_118,local_158);
    std::__cxx11::string::~string(local_158);
  }
  indent_abi_cxx11_(in_RDI,extra_00);
  Printf<std::__cxx11::string,std::__cxx11::string&>
            ((char *)fmt,args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  poVar1 = std::operator<<((ostream *)&std::cout,local_118);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  std::operator<<(poVar1,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9da353);
  return;
}

Assistant:

void FormattingScene::Material(const std::string &name, ParsedParameterVector params,
                               FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    if (upgrade)
        dict.RenameUsedTextures(definedTextures);

    std::string extra;
    std::string newName = name;
    if (upgrade)
        extra = upgradeMaterial(&newName, &dict, loc);

#if 0
    // Hack for landscape upgrade
    if (upgrade && name == "mix") {
        ParameterDictionary dict(params, RGBColorSpace::sRGB);
        const ParameterDictionary &d1 = namedMaterialDictionaries[dict.GetOneString("namedmaterial1", "")];
        const ParameterDictionary &d2 = namedMaterialDictionaries[dict.GetOneString("namedmaterial2", "")];

        if (!d1.GetTexture("reflectance").empty() &&
            !d2.GetTexture("transmittance").empty()) {
            Printf("%sMaterial \"diffusetransmission\"\n", indent());
            Printf("%s\"texture reflectance\" \"%s\"\n", indent(1), d1.GetTexture("reflectance"));
            Printf("%s\"texture transmittance\" \"%s\"\n", indent(1), d2.GetTexture("transmittance"));

            if (!d1.GetTexture("displacement").empty())
                Printf("%s\"texture displacement\" \"%s\"\n", indent(1), d1.GetTexture("displacement"));
            else if (!d2.GetTexture("displacement").empty())
                Printf("%s\"texture displacement\" \"%s\"\n", indent(1), d2.GetTexture("displacement"));

            Printf("%s\"float scale\" 0.5\n", indent(1));

            return;
        }
    }
#endif

    Printf("%sMaterial \"%s\"\n", indent(), newName);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}